

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O2

int luaopen_stm(lua_State *L)

{
  luaL_Reg reader [2];
  luaL_Reg writer [2];
  
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,3);
  lua_pushcclosure(L,lcopy,0);
  lua_setfield(L,-2,"copy");
  writer[1].name = (char *)0x0;
  writer[1].func = (lua_CFunction)0x0;
  writer[0].name = "new";
  writer[0].func = lnewwriter;
  lua_createtable(L,0,2);
  lua_pushcclosure(L,ldeletewriter,0);
  lua_setfield(L,-2,"__gc");
  lua_pushcclosure(L,lupdate,0);
  lua_setfield(L,-2,"__call");
  luaL_setfuncs(L,writer,1);
  reader[1].name = (char *)0x0;
  reader[1].func = (lua_CFunction)0x0;
  reader[0].name = "newcopy";
  reader[0].func = lnewreader;
  lua_createtable(L,0,2);
  lua_pushcclosure(L,ldeletereader,0);
  lua_setfield(L,-2,"__gc");
  lua_pushcclosure(L,lread,0);
  lua_setfield(L,-2,"__call");
  luaL_setfuncs(L,reader,1);
  return 1;
}

Assistant:

int
luaopen_stm(lua_State *L) {
	luaL_checkversion(L);
	lua_createtable(L, 0, 3);

	lua_pushcfunction(L, lcopy);
	lua_setfield(L, -2, "copy");

	luaL_Reg writer[] = {
		{ "new", lnewwriter },
		{ NULL, NULL },
	};
	lua_createtable(L, 0, 2);
	lua_pushcfunction(L, ldeletewriter),
	lua_setfield(L, -2, "__gc");
	lua_pushcfunction(L, lupdate),
	lua_setfield(L, -2, "__call");
	luaL_setfuncs(L, writer, 1);

	luaL_Reg reader[] = {
		{ "newcopy", lnewreader },
		{ NULL, NULL },
	};
	lua_createtable(L, 0, 2);
	lua_pushcfunction(L, ldeletereader),
	lua_setfield(L, -2, "__gc");
	lua_pushcfunction(L, lread),
	lua_setfield(L, -2, "__call");
	luaL_setfuncs(L, reader, 1);

	return 1;
}